

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::BeginLoopFixedInst::Exec
          (BeginLoopFixedInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  Label beginLabel;
  LoopInfo *origLoopInfo;
  RestoreLoopCont *this_00;
  undefined4 *puVar3;
  RewindLoopFixedCont *this_01;
  LoopInfo *loopInfo;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  BeginLoopFixedInst *this_local;
  
  origLoopInfo = Matcher::LoopIdToLoopInfo
                           (matcher,(this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  if (((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.hasOuterLoops & 1U) != 0) {
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RestoreLoopCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    RestoreLoopCont::RestoreLoopCont
              (this_00,(this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId,origLoopInfo,
               matcher);
    Matcher::PushStats(matcher,contStack,input);
  }
  origLoopInfo->number = 0;
  origLoopInfo->startInputOffset = *inputOffset;
  if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower == 0) {
    if ((BeginLoopFixedInst *)*instPointer != this) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0xcef,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_01 = (RewindLoopFixedCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RewindLoopFixedCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    beginLabel = Matcher::InstPointerToLabel(matcher,*instPointer);
    RewindLoopFixedCont::RewindLoopFixedCont(this_01,beginLabel,true);
    Matcher::PushStats(matcher,contStack,input);
  }
  *instPointer = *instPointer + 0x17;
  return false;
}

Assistant:

inline bool BeginLoopFixedInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop is contained in an outer loop, continuation stack may already have a RewindLoopFixed entry for
        // this loop. We must make sure it's state is preserved on backtrack.
        if (hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // startInputOffset will stay here for all iterations, and we'll use number of length to figure out
        // where in the input to rewind to
        loopInfo->number = 0;
        loopInfo->startInputOffset = inputOffset;

        if (repeats.lower == 0)
        {
            // CHOICEPOINT: Try one iteration of body. Failure of body will rewind input to here and resume with follow.
            Assert(instPointer == (uint8*)this);
            PUSH(contStack, RewindLoopFixedCont, matcher.InstPointerToLabel(instPointer), true);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        // else: Must match minimum iterations, so continue to loop body. Failure of body signals failure of entire loop.

        instPointer += sizeof(*this);
        return false;
    }